

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void __thiscall deqp::gls::ContextArray::glBind(ContextArray *this,deUint32 loc)

{
  uint uVar1;
  Context *pCVar2;
  bool bVar3;
  GLenum GVar4;
  deUint32 dVar5;
  deUint32 loc_local;
  ContextArray *this_local;
  
  if (this->m_storage == STORAGE_BUFFER) {
    pCVar2 = this->m_ctx;
    GVar4 = targetToGL(this->m_target);
    (*pCVar2->_vptr_Context[0x25])(pCVar2,(ulong)GVar4,(ulong)this->m_glBuffer);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar5,"glBindBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x230);
    bVar3 = inputTypeIsFloatType(this->m_inputType);
    if (bVar3) {
      pCVar2 = this->m_ctx;
      uVar1 = this->m_componentCount;
      GVar4 = inputTypeToGL(this->m_inputType);
      (*pCVar2->_vptr_Context[0x4e])
                (pCVar2,(ulong)loc,(ulong)uVar1,(ulong)GVar4,(ulong)(this->m_normalize & 1),
                 (ulong)(uint)this->m_stride,(long)this->m_offset);
      dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar5,"glVertexAttribPointer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                      ,0x24b);
    }
    else {
      bVar3 = outputTypeIsFloatType(this->m_outputType);
      if (bVar3) {
        pCVar2 = this->m_ctx;
        uVar1 = this->m_componentCount;
        GVar4 = inputTypeToGL(this->m_inputType);
        (*pCVar2->_vptr_Context[0x4e])
                  (pCVar2,(ulong)loc,(ulong)uVar1,(ulong)GVar4,(ulong)(this->m_normalize & 1),
                   (ulong)(uint)this->m_stride,(long)this->m_offset);
        dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar5,"glVertexAttribPointer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                        ,0x23a);
      }
      else {
        pCVar2 = this->m_ctx;
        uVar1 = this->m_componentCount;
        GVar4 = inputTypeToGL(this->m_inputType);
        (*pCVar2->_vptr_Context[0x4f])
                  (pCVar2,(ulong)loc,(ulong)uVar1,(ulong)GVar4,(ulong)(uint)this->m_stride,
                   (long)this->m_offset);
        dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar5,"glVertexAttribIPointer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                        ,0x240);
      }
    }
    pCVar2 = this->m_ctx;
    GVar4 = targetToGL(this->m_target);
    (*pCVar2->_vptr_Context[0x25])(pCVar2,(ulong)GVar4,0);
  }
  else if (this->m_storage == STORAGE_USER) {
    pCVar2 = this->m_ctx;
    GVar4 = targetToGL(this->m_target);
    (*pCVar2->_vptr_Context[0x25])(pCVar2,(ulong)GVar4,0);
    dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar5,"glBindBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x253);
    bVar3 = inputTypeIsFloatType(this->m_inputType);
    if (bVar3) {
      pCVar2 = this->m_ctx;
      uVar1 = this->m_componentCount;
      GVar4 = inputTypeToGL(this->m_inputType);
      (*pCVar2->_vptr_Context[0x4e])
                (pCVar2,(ulong)loc,(ulong)uVar1,(ulong)GVar4,(ulong)(this->m_normalize & 1),
                 (ulong)(uint)this->m_stride,this->m_data + this->m_offset);
      dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
      glu::checkError(dVar5,"glVertexAttribPointer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                      ,0x26e);
    }
    else {
      bVar3 = outputTypeIsFloatType(this->m_outputType);
      if (bVar3) {
        pCVar2 = this->m_ctx;
        uVar1 = this->m_componentCount;
        GVar4 = inputTypeToGL(this->m_inputType);
        (*pCVar2->_vptr_Context[0x4e])
                  (pCVar2,(ulong)loc,(ulong)uVar1,(ulong)GVar4,(ulong)(this->m_normalize & 1),
                   (ulong)(uint)this->m_stride,this->m_data + this->m_offset);
        dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar5,"glVertexAttribPointer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                        ,0x25d);
      }
      else {
        pCVar2 = this->m_ctx;
        uVar1 = this->m_componentCount;
        GVar4 = inputTypeToGL(this->m_inputType);
        (*pCVar2->_vptr_Context[0x4f])
                  (pCVar2,(ulong)loc,(ulong)uVar1,(ulong)GVar4,(ulong)(uint)this->m_stride,
                   this->m_data + this->m_offset);
        dVar5 = (*this->m_ctx->_vptr_Context[0x79])();
        glu::checkError(dVar5,"glVertexAttribIPointer()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                        ,0x263);
      }
    }
  }
  return;
}

Assistant:

void ContextArray::glBind (deUint32 loc)
{
	if (m_storage == STORAGE_BUFFER)
	{
		m_ctx.bindBuffer(targetToGL(m_target), m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

		if (!inputTypeIsFloatType(m_inputType))
		{
			// Input is not float type

			if (outputTypeIsFloatType(m_outputType))
			{
				// Output type is float type
				m_ctx.vertexAttribPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_normalize, m_stride, (GLvoid*)((GLintptr)m_offset));
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
			}
			else
			{
				// Output type is int type
				m_ctx.vertexAttribIPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_stride, (GLvoid*)((GLintptr)m_offset));
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribIPointer()");
			}
		}
		else
		{
			// Input type is float type

			// Output type must be float type
			DE_ASSERT(m_outputType == OUTPUTTYPE_FLOAT || m_outputType == OUTPUTTYPE_VEC2 || m_outputType == OUTPUTTYPE_VEC3 || m_outputType == OUTPUTTYPE_VEC4);

			m_ctx.vertexAttribPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_normalize, m_stride, (GLvoid*)((GLintptr)m_offset));
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
		}

		m_ctx.bindBuffer(targetToGL(m_target), 0);
	}
	else if (m_storage == STORAGE_USER)
	{
		m_ctx.bindBuffer(targetToGL(m_target), 0);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

		if (!inputTypeIsFloatType(m_inputType))
		{
			// Input is not float type

			if (outputTypeIsFloatType(m_outputType))
			{
				// Output type is float type
				m_ctx.vertexAttribPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_normalize, m_stride, m_data + m_offset);
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
			}
			else
			{
				// Output type is int type
				m_ctx.vertexAttribIPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_stride, m_data + m_offset);
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribIPointer()");
			}
		}
		else
		{
			// Input type is float type

			// Output type must be float type
			DE_ASSERT(m_outputType == OUTPUTTYPE_FLOAT || m_outputType == OUTPUTTYPE_VEC2 || m_outputType == OUTPUTTYPE_VEC3 || m_outputType == OUTPUTTYPE_VEC4);

			m_ctx.vertexAttribPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_normalize, m_stride, m_data + m_offset);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
		}
	}
	else
		DE_ASSERT(false);
}